

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void expandFormatArguments<long>(vector<String,_std::allocator<String>_> *data,long *arg)

{
  String local_30;
  
  String::fromNumber(&local_30,*arg);
  std::vector<String,_std::allocator<String>_>::push_back(data,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._string._M_dataplus._M_p != &local_30._string.field_2) {
    operator_delete(local_30._string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}